

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElasticityCosseratAdvanced::ComputeStiffnessMatrix
          (ChElasticityCosseratAdvanced *this,ChMatrixNM<double,_6,_6> *K,ChVector<double> *strain_n
          ,ChVector<double> *strain_m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1c] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1d] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1e] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1f] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x20] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x21] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x22] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x23] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x18] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x19] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1a] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1b] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1c] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1d] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1e] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1f] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x10] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x11] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x12] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x13] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x14] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x15] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x16] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x17] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[8] = 0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[9] = 0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[10] = 0.0
  ;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xb] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xc] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xd] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xe] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xf] =
       0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0] = 0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[1] = 0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[2] = 0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[3] = 0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[4] = 0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[5] = 0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[6] = 0.0;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[7] = 0.0;
  dVar11 = cos(this->alpha);
  auVar14._0_8_ = sin(this->alpha);
  auVar14._8_56_ = extraout_var;
  dVar1 = (this->super_ChElasticityCosseratSimple).E;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  dVar2 = (this->super_ChElasticityCosseratSimple).A;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar2;
  dVar3 = (this->super_ChElasticityCosseratSimple).Iyy;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar3;
  dVar4 = (this->super_ChElasticityCosseratSimple).Izz;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar4;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar11 * dVar11;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar14._0_8_ * auVar14._0_8_ * dVar4;
  auVar10 = vfmadd231sd_fma(auVar35,auVar26,auVar22);
  dVar5 = this->Cz;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar5 * dVar5;
  auVar35 = vfmadd213sd_fma(auVar39,auVar20,auVar10);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar14._0_8_ * auVar14._0_8_ * dVar3;
  auVar10 = vfmadd231sd_fma(auVar33,auVar30,auVar22);
  dVar3 = this->Cy;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar3;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar3 * dVar3;
  auVar20 = vfmadd213sd_fma(auVar36,auVar20,auVar10);
  dVar6 = dVar2 * dVar5 * dVar1;
  auVar9._8_8_ = 0x8000000000000000;
  auVar9._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar23,auVar9);
  dVar7 = dVar2 * dVar1 * auVar10._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar4 * dVar1;
  auVar10 = vfmsub231sd_fma(auVar31,auVar16,auVar26);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar2 * dVar5 * dVar3 * dVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar11 * auVar10._0_8_;
  auVar17 = vfmsub231sd_fma(auVar17,auVar14._0_16_,auVar27);
  dVar12 = cos(this->beta);
  auVar15._0_8_ = sin(this->beta);
  auVar15._8_56_ = extraout_var_00;
  dVar3 = (this->super_ChElasticityCosseratSimple).G;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar3;
  dVar4 = (this->super_ChElasticityCosseratSimple).A;
  dVar11 = dVar3 * (this->super_ChElasticityCosseratSimple).Ks_y * dVar4;
  dVar4 = dVar4 * dVar3 * (this->super_ChElasticityCosseratSimple).Ks_z;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar12;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar11;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar12 * dVar12;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar15._0_8_ * auVar15._0_8_ * dVar4;
  auVar9 = vfmadd231sd_fma(auVar34,auVar24,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar12 * dVar12 * dVar4;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar15._0_8_ * auVar15._0_8_;
  auVar16 = vfmadd231sd_fma(auVar29,auVar24,auVar32);
  dVar3 = this->Sz;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (this->super_ChElasticityCosseratSimple).J;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar11 * dVar3 * dVar3;
  auVar10 = vfmadd231sd_fma(auVar37,auVar18,auVar10);
  dVar5 = this->Sy;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar4;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar5 * dVar5;
  auVar10 = vfmadd213sd_fma(auVar38,auVar21,auVar10);
  dVar8 = dVar12 * auVar15._0_8_ * (dVar4 - dVar11);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4 * dVar5;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar12 * dVar11 * dVar3;
  auVar18 = vfmsub231sd_fma(auVar25,auVar19,auVar15._0_16_);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar15._0_8_ * dVar11 * dVar3;
  auVar13 = vfmadd231sd_fma(auVar13,auVar19,auVar40);
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0] =
       dVar1 * dVar2;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[4] =
       dVar6;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[5] =
       dVar7;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[7] =
       auVar9._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[8] =
       dVar8;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[9] =
       auVar18._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xd] =
       dVar8;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xe] =
       auVar16._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xf] =
       auVar13._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x13] =
       auVar18._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x14] =
       auVar13._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x15] =
       auVar10._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x18] =
       dVar6;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1c] =
       auVar35._0_8_ * dVar1;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1d] =
       auVar17._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1e] =
       dVar7;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x22] =
       auVar17._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x23] =
       dVar1 * auVar20._0_8_;
  return;
}

Assistant:

void ChElasticityCosseratAdvanced::ComputeStiffnessMatrix(ChMatrixNM<double, 6, 6>& K,
                                                          const ChVector<>& strain_n,
                                                          const ChVector<>& strain_m) {
    K.setZero(6, 6);
    double cos_alpha = cos(alpha);
    double sin_alpha = sin(alpha);
    double a11 = E * A;
    double a22 = E * (Iyy * pow(cos_alpha, 2.) + Izz * pow(sin_alpha, 2.) + Cz * Cz * A);
    double a33 = E * (Izz * pow(cos_alpha, 2.) + Iyy * pow(sin_alpha, 2.) + Cy * Cy * A);
    double a12 = Cz * E * A;
    double a13 = -Cy * E * A;
    double a23 = (E * Iyy - E * Izz) * cos_alpha * sin_alpha - E * Cy * Cz * A;
    double cos_beta = cos(beta);
    double sin_beta = sin(beta);
    double KsyGA = Ks_y * G * A;
    double KszGA = Ks_z * G * A;
    double s11 = KsyGA * pow(cos_beta, 2.) + KszGA * pow(sin_beta, 2.);
    double s22 = KsyGA * pow(sin_beta, 2.) + KszGA * pow(cos_beta, 2.);  // ..+s_loc_12*sin(beta)*cos(beta);
    double s33 = G * J + Sz * Sz * KsyGA + Sy * Sy * KszGA;
    double s12 = (KszGA - KsyGA) * sin_beta * cos_beta;
    double s13 = Sy * KszGA * sin_beta - Sz * KsyGA * cos_beta;
    double s23 = Sy * KszGA * cos_beta + Sz * KsyGA * sin_beta;

    K(0, 0) = a11;
    K(0, 4) = a12;
    K(0, 5) = a13;
    K(1, 1) = s11;
    K(1, 2) = s12;
    K(1, 3) = s13;
    K(2, 1) = s12;
    K(2, 2) = s22;
    K(2, 3) = s23;
    K(3, 1) = s13;
    K(3, 2) = s23;
    K(3, 3) = s33;
    K(4, 0) = a12;
    K(4, 4) = a22;
    K(4, 5) = a23;
    K(5, 0) = a13;
    K(5, 4) = a23;
    K(5, 5) = a33;
}